

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

int __thiscall QToolBarAreaLayout::remove(QToolBarAreaLayout *this,char *__filename)

{
  long *plVar1;
  ulong uVar2;
  pointer pQVar3;
  pointer pQVar4;
  long lVar5;
  int iVar6;
  ulong i;
  ulong i_00;
  QList<QToolBarAreaLayoutItem> *this_00;
  QToolBarAreaLayoutInfo *this_01;
  long lVar7;
  bool bVar8;
  
  lVar5 = 0;
  do {
    if (this->docks[lVar5].lines.d.size != 0) {
      this_01 = this->docks + lVar5;
      i_00 = 0;
      do {
        pQVar3 = QList<QToolBarAreaLayoutLine>::data(&this_01->lines);
        iVar6 = 0;
        bVar8 = pQVar3[i_00].toolBarItems.d.size != 0;
        if (bVar8) {
          this_00 = &pQVar3[i_00].toolBarItems;
          pQVar4 = QList<QToolBarAreaLayoutItem>::data(this_00);
          if (pQVar4->widgetItem == (QLayoutItem *)__filename) {
            i = 0;
          }
          else {
            i = 0;
            lVar7 = 0x18;
            do {
              i = i + 1;
              uVar2 = pQVar3[i_00].toolBarItems.d.size;
              bVar8 = i < uVar2;
              if (uVar2 <= i) {
                iVar6 = 0;
                goto LAB_004ba08e;
              }
              pQVar4 = QList<QToolBarAreaLayoutItem>::data(this_00);
              plVar1 = (long *)((long)&pQVar4->widgetItem + lVar7);
              lVar7 = lVar7 + 0x18;
            } while ((char *)*plVar1 != __filename);
          }
          QList<QToolBarAreaLayoutItem>::removeAt(this_00,i);
          iVar6 = 1;
          if (pQVar3[i_00].toolBarItems.d.size == 0) {
            QList<QToolBarAreaLayoutLine>::removeAt(&this_01->lines,i_00);
          }
        }
LAB_004ba08e:
        if (bVar8) goto LAB_004ba0a5;
        i_00 = i_00 + 1;
      } while (i_00 < (ulong)(this_01->lines).d.size);
    }
    iVar6 = 5;
LAB_004ba0a5:
    if (((iVar6 != 5) && (iVar6 != 0)) || (lVar5 = lVar5 + 1, lVar5 == 4)) {
      return (int)lVar5;
    }
  } while( true );
}

Assistant:

void QToolBarAreaLayout::remove(QLayoutItem *item)
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            QToolBarAreaLayoutLine &line = dock.lines[j];

            for (int k = 0; k < line.toolBarItems.size(); k++) {
                if (line.toolBarItems[k].widgetItem == item) {
                    line.toolBarItems.removeAt(k);
                    if (line.toolBarItems.isEmpty())
                        dock.lines.removeAt(j);
                    return;
                }
            }
        }
    }
}